

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTessellationShaderTCTE.cpp
# Opt level: O2

void __thiscall
glcts::TessellationShaderTCTEgl_TessLevel::initTestDescriptor
          (TessellationShaderTCTEgl_TessLevel *this,_tessellation_test_type test_type,
          _test_descriptor *out_test_ptr,_tessellation_shader_vertex_spacing vertex_spacing_mode)

{
  ostringstream *this_00;
  undefined4 uVar1;
  undefined4 uVar2;
  int iVar3;
  GLuint GVar4;
  deUint32 dVar5;
  GLint GVar6;
  undefined4 extraout_var;
  ulong uVar8;
  TestError *this_01;
  _tessellation_shader_vertex_spacing vertex_spacing;
  long lVar9;
  GLint link_status;
  string te_body_string;
  char *tc_body;
  char *vs_body;
  char *local_1f8;
  char *fs_body;
  char *te_body_string_raw;
  char *varyings [2];
  ostream local_1a8;
  long lVar7;
  
  out_test_ptr->type = test_type;
  out_test_ptr->vertex_spacing = vertex_spacing_mode;
  iVar3 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar7 = CONCAT44(extraout_var,iVar3);
  GVar4 = (**(code **)(lVar7 + 0x3c8))();
  out_test_ptr->po_id = GVar4;
  dVar5 = (**(code **)(lVar7 + 0x800))();
  glu::checkError(dVar5,"glCreateProgram() failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTCTE.cpp"
                  ,0xd02);
  GVar4 = (**(code **)(lVar7 + 0x3f0))(0x8b30);
  out_test_ptr->fs_id = GVar4;
  GVar4 = (**(code **)(lVar7 + 0x3f0))(0x8b31);
  out_test_ptr->vs_id = GVar4;
  if (test_type < TESSELLATION_TEST_TYPE_COUNT) {
    GVar4 = (**(code **)(lVar7 + 0x3f0))
                      ((this->super_TestCaseBase).m_glExtTokens.TESS_EVALUATION_SHADER);
    out_test_ptr->tes_id = GVar4;
    if (test_type == TESSELLATION_TEST_TYPE_FIRST) {
      GVar4 = (**(code **)(lVar7 + 0x3f0))
                        ((this->super_TestCaseBase).m_glExtTokens.TESS_CONTROL_SHADER);
      out_test_ptr->tcs_id = GVar4;
    }
  }
  dVar5 = (**(code **)(lVar7 + 0x800))();
  glu::checkError(dVar5,"glCreateShader() failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTCTE.cpp"
                  ,0xd12);
  fs_body = "${VERSION}\n\nvoid main()\n{\n}\n";
  TestCaseBase::shaderSourceSpecialized(&this->super_TestCaseBase,out_test_ptr->fs_id,1,&fs_body);
  dVar5 = (**(code **)(lVar7 + 0x800))();
  glu::checkError(dVar5,"glShaderSource() failed for fragment shader object",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTCTE.cpp"
                  ,0xd1c);
  tc_body = 
  "${VERSION}\n\n${TESSELLATION_SHADER_REQUIRE}\n\nlayout (vertices = 4) out;\n\nuniform vec2 inner_tess_levels;\nuniform vec4 outer_tess_levels;\n\nvoid main()\n{\n    gl_out           [gl_InvocationID].gl_Position = gl_in[gl_InvocationID].gl_Position;\n    gl_TessLevelInner[0]                           = inner_tess_levels[0];\n    gl_TessLevelInner[1]                           = inner_tess_levels[1];\n    gl_TessLevelOuter[0]                           = outer_tess_levels[0];\n    gl_TessLevelOuter[1]                           = outer_tess_levels[1];\n    gl_TessLevelOuter[2]                           = outer_tess_levels[2];\n    gl_TessLevelOuter[3]                           = outer_tess_levels[3];\n}\n"
  ;
  if (test_type == TESSELLATION_TEST_TYPE_FIRST) {
    TestCaseBase::shaderSourceSpecialized(&this->super_TestCaseBase,out_test_ptr->tcs_id,1,&tc_body)
    ;
    dVar5 = (**(code **)(lVar7 + 0x800))();
    glu::checkError(dVar5,"glShaderSource() failed for tessellation control shader object",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTCTE.cpp"
                    ,0xd37);
  }
  else if (TESSELLATION_TEST_TYPE_TES < test_type) goto LAB_00d18e4d;
  std::__cxx11::stringstream::stringstream((stringstream *)varyings);
  te_body_string._M_dataplus._M_p = (pointer)&te_body_string.field_2;
  te_body_string._M_string_length._0_4_ = 0;
  te_body_string._M_string_length._4_4_ = 0;
  te_body_string.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&vs_body,"VERTEX_SPACING_MODE",(allocator<char> *)&link_status);
  TessellationShaderUtils::getESTokenForVertexSpacingMode_abi_cxx11_
            ((string *)&link_status,(TessellationShaderUtils *)(ulong)vertex_spacing_mode,
             vertex_spacing);
  std::operator<<(&local_1a8,
                  "${VERSION}\n\n${TESSELLATION_SHADER_REQUIRE}\n\nlayout (isolines, point_mode, VERTEX_SPACING_MODE) in;\n\nout vec2 result_tess_level_inner;\nout vec4 result_tess_level_outer;\n\nvoid main()\n{\n    gl_Position = gl_in[0].gl_Position;\n\n    result_tess_level_inner = vec2(gl_TessLevelInner[0],\n                                   gl_TessLevelInner[1]);\n    result_tess_level_outer = vec4(gl_TessLevelOuter[0],\n                                   gl_TessLevelOuter[1],\n                                   gl_TessLevelOuter[2],\n                                   gl_TessLevelOuter[3]);\n}\n"
                 );
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)&te_body_string,(string *)&te_body_string_raw);
  std::__cxx11::string::~string((string *)&te_body_string_raw);
  while( true ) {
    uVar8 = std::__cxx11::string::find((string *)&te_body_string,(ulong)&vs_body);
    if (uVar8 == 0xffffffffffffffff) break;
    std::__cxx11::string::replace((ulong)&te_body_string,uVar8,local_1f8);
    std::__cxx11::string::_M_assign((string *)&te_body_string);
  }
  te_body_string_raw = te_body_string._M_dataplus._M_p;
  TestCaseBase::shaderSourceSpecialized
            (&this->super_TestCaseBase,out_test_ptr->tes_id,1,&te_body_string_raw);
  dVar5 = (**(code **)(lVar7 + 0x800))();
  glu::checkError(dVar5,"glShaderSource() failed for tessellation evaluation shader object",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTCTE.cpp"
                  ,0xd6a);
  std::__cxx11::string::~string((string *)&link_status);
  std::__cxx11::string::~string((string *)&vs_body);
  std::__cxx11::string::~string((string *)&te_body_string);
  std::__cxx11::stringstream::~stringstream((stringstream *)varyings);
LAB_00d18e4d:
  vs_body = "${VERSION}\n\nvoid main()\n{\n    gl_Position = vec4(1.0, 2.0, 3.0, 4.0);\n}\n";
  TestCaseBase::shaderSourceSpecialized(&this->super_TestCaseBase,out_test_ptr->vs_id,1,&vs_body);
  dVar5 = (**(code **)(lVar7 + 0x800))();
  glu::checkError(dVar5,"glShaderSource() failed for vertex shader object",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTCTE.cpp"
                  ,0xd76);
  te_body_string._M_dataplus._M_p._0_4_ = out_test_ptr->fs_id;
  uVar1 = out_test_ptr->tcs_id;
  uVar2 = out_test_ptr->tes_id;
  te_body_string._M_dataplus._M_p._4_4_ = uVar1;
  te_body_string._M_string_length._0_4_ = uVar2;
  te_body_string._M_string_length._4_4_ = out_test_ptr->vs_id;
  lVar9 = 0;
  do {
    if (lVar9 == 4) {
      link_status = 0;
      varyings[0] = "result_tess_level_inner";
      varyings[1]._0_4_ = 0x17b603e;
      varyings[1]._4_4_ = 0;
      (**(code **)(lVar7 + 0x14c8))(out_test_ptr->po_id,2,varyings,0x8c8c);
      dVar5 = (**(code **)(lVar7 + 0x800))();
      glu::checkError(dVar5,"glTransformFeedbackVaryings() call failed",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTCTE.cpp"
                      ,0xd9a);
      (**(code **)(lVar7 + 0x10))(out_test_ptr->po_id,out_test_ptr->fs_id);
      (**(code **)(lVar7 + 0x10))(out_test_ptr->po_id,out_test_ptr->vs_id);
      if (out_test_ptr->tcs_id != 0) {
        (**(code **)(lVar7 + 0x10))(out_test_ptr->po_id);
      }
      if (out_test_ptr->tes_id != 0) {
        (**(code **)(lVar7 + 0x10))(out_test_ptr->po_id);
      }
      dVar5 = (**(code **)(lVar7 + 0x800))();
      glu::checkError(dVar5,"glAttachShader() call(s) failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTCTE.cpp"
                      ,0xda9);
      (**(code **)(lVar7 + 0xce8))(out_test_ptr->po_id);
      dVar5 = (**(code **)(lVar7 + 0x800))();
      glu::checkError(dVar5,"glLinkProgram() call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTCTE.cpp"
                      ,0xdac);
      (**(code **)(lVar7 + 0x9d8))(out_test_ptr->po_id,0x8b82,&link_status);
      dVar5 = (**(code **)(lVar7 + 0x800))();
      glu::checkError(dVar5,"glGetProgramiv() call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTCTE.cpp"
                      ,0xdaf);
      if (link_status == 1) {
        GVar6 = (**(code **)(lVar7 + 0xb48))(out_test_ptr->po_id,"inner_tess_levels");
        out_test_ptr->inner_tess_levels_uniform_location = GVar6;
        GVar6 = (**(code **)(lVar7 + 0xb48))(out_test_ptr->po_id,"outer_tess_levels");
        out_test_ptr->outer_tess_levels_uniform_location = GVar6;
        dVar5 = (**(code **)(lVar7 + 0x800))();
        glu::checkError(dVar5,"glGetUniformLocation() call(s) failed",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTCTE.cpp"
                        ,0xdba);
        return;
      }
      this_01 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this_01,"Program linking failed",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTCTE.cpp"
                 ,0xdb3);
LAB_00d19169:
      __cxa_throw(this_01,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
    link_status = 0;
    iVar3 = *(int *)((long)&te_body_string._M_dataplus._M_p + lVar9 * 4);
    if (iVar3 != 0) {
      (**(code **)(lVar7 + 0x248))(iVar3);
      dVar5 = (**(code **)(lVar7 + 0x800))();
      glu::checkError(dVar5,"glCompileShader() call failed",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTCTE.cpp"
                      ,0xd85);
      (**(code **)(lVar7 + 0xa70))(iVar3,0x8b81,&link_status);
      dVar5 = (**(code **)(lVar7 + 0x800))();
      glu::checkError(dVar5,"glGetShaderiv() call failed",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTCTE.cpp"
                      ,0xd88);
      if (link_status != 1) {
        varyings[0] = (char *)((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx)->
                              m_log;
        this_00 = (ostringstream *)(varyings + 1);
        std::__cxx11::ostringstream::ostringstream(this_00);
        std::operator<<((ostream *)this_00,"Compilation of shader object at index ");
        std::ostream::_M_insert<unsigned_long>((ulong)this_00);
        std::operator<<((ostream *)this_00," failed.");
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)varyings,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream(this_00);
        this_01 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (this_01,"Shader compilation failed",(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTCTE.cpp"
                   ,0xd8f);
        goto LAB_00d19169;
      }
    }
    lVar9 = lVar9 + 1;
  } while( true );
}

Assistant:

void TessellationShaderTCTEgl_TessLevel::initTestDescriptor(_tessellation_test_type				test_type,
															_test_descriptor*					out_test_ptr,
															_tessellation_shader_vertex_spacing vertex_spacing_mode)
{
	out_test_ptr->type			 = test_type;
	out_test_ptr->vertex_spacing = vertex_spacing_mode;

	/* Generate a program object we will later configure */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	out_test_ptr->po_id = gl.createProgram();

	GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateProgram() failed");

	/* Generate shader objects the test will use */
	out_test_ptr->fs_id = gl.createShader(GL_FRAGMENT_SHADER);
	out_test_ptr->vs_id = gl.createShader(GL_VERTEX_SHADER);

	if (test_type == TESSELLATION_TEST_TYPE_TCS_TES || test_type == TESSELLATION_TEST_TYPE_TES)
	{
		out_test_ptr->tes_id = gl.createShader(m_glExtTokens.TESS_EVALUATION_SHADER);
	}

	if (test_type == TESSELLATION_TEST_TYPE_TCS_TES)
	{
		out_test_ptr->tcs_id = gl.createShader(m_glExtTokens.TESS_CONTROL_SHADER);
	}

	GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateShader() failed");

	/* Configure fragment shader */
	const char* fs_body = "${VERSION}\n"
						  "\n"
						  "void main()\n"
						  "{\n"
						  "}\n";

	shaderSourceSpecialized(out_test_ptr->fs_id, 1 /* count */, &fs_body);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glShaderSource() failed for fragment shader object");

	/* Configure tessellation control shader */
	const char* tc_body = "${VERSION}\n"
						  "\n"
						  /* Required EXT_tessellation_shader functionality */
						  "${TESSELLATION_SHADER_REQUIRE}\n"
						  "\n"
						  "layout (vertices = 4) out;\n"
						  "\n"
						  "uniform vec2 inner_tess_levels;\n"
						  "uniform vec4 outer_tess_levels;\n"
						  "\n"
						  "void main()\n"
						  "{\n"
						  "    gl_out           [gl_InvocationID].gl_Position = gl_in[gl_InvocationID].gl_Position;\n"
						  "    gl_TessLevelInner[0]                           = inner_tess_levels[0];\n"
						  "    gl_TessLevelInner[1]                           = inner_tess_levels[1];\n"
						  "    gl_TessLevelOuter[0]                           = outer_tess_levels[0];\n"
						  "    gl_TessLevelOuter[1]                           = outer_tess_levels[1];\n"
						  "    gl_TessLevelOuter[2]                           = outer_tess_levels[2];\n"
						  "    gl_TessLevelOuter[3]                           = outer_tess_levels[3];\n"
						  "}\n";

	if (test_type == TESSELLATION_TEST_TYPE_TCS_TES)
	{
		shaderSourceSpecialized(out_test_ptr->tcs_id, 1 /* count */, &tc_body);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glShaderSource() failed for tessellation control shader object");
	}

	/* Configure tessellation evaluation shader */
	const char* te_body = "${VERSION}\n"
						  "\n"
						  "${TESSELLATION_SHADER_REQUIRE}\n"
						  "\n"
						  "layout (isolines, point_mode, VERTEX_SPACING_MODE) in;\n"
						  "\n"
						  "out vec2 result_tess_level_inner;\n"
						  "out vec4 result_tess_level_outer;\n"
						  "\n"
						  "void main()\n"
						  "{\n"
						  "    gl_Position = gl_in[0].gl_Position;\n"
						  "\n"
						  "    result_tess_level_inner = vec2(gl_TessLevelInner[0],\n"
						  "                                   gl_TessLevelInner[1]);\n"
						  "    result_tess_level_outer = vec4(gl_TessLevelOuter[0],\n"
						  "                                   gl_TessLevelOuter[1],\n"
						  "                                   gl_TessLevelOuter[2],\n"
						  "                                   gl_TessLevelOuter[3]);\n"
						  "}\n";

	if (test_type == TESSELLATION_TEST_TYPE_TCS_TES || test_type == TESSELLATION_TEST_TYPE_TES)
	{
		/* Replace VERTEX_SPACING_MODE with the mode provided by the caller */
		std::stringstream te_body_stringstream;
		std::string		  te_body_string;
		const std::string token = "VERTEX_SPACING_MODE";
		std::size_t		  token_index;
		std::string		  vertex_spacing_string =
			TessellationShaderUtils::getESTokenForVertexSpacingMode(vertex_spacing_mode);

		te_body_stringstream << te_body;
		te_body_string = te_body_stringstream.str();

		token_index = te_body_string.find(token);

		while (token_index != std::string::npos)
		{
			te_body_string = te_body_string.replace(token_index, token.length(), vertex_spacing_string.c_str());

			token_index = te_body_string.find(token);
		}

		/* Set the shader source */
		const char* te_body_string_raw = te_body_string.c_str();

		shaderSourceSpecialized(out_test_ptr->tes_id, 1 /* count */, &te_body_string_raw);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glShaderSource() failed for tessellation evaluation shader object");
	}

	/* Configure vertex shader */
	const char* vs_body = "${VERSION}\n"
						  "\n"
						  "void main()\n"
						  "{\n"
						  "    gl_Position = vec4(1.0, 2.0, 3.0, 4.0);\n"
						  "}\n";

	shaderSourceSpecialized(out_test_ptr->vs_id, 1 /* count */, &vs_body);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glShaderSource() failed for vertex shader object");

	/* Compile all shaders of our interest */
	const glw::GLuint shaders[] = { out_test_ptr->fs_id, out_test_ptr->tcs_id, out_test_ptr->tes_id,
									out_test_ptr->vs_id };
	const unsigned int n_shaders = sizeof(shaders) / sizeof(shaders[0]);

	for (unsigned int n_shader = 0; n_shader < n_shaders; ++n_shader)
	{
		glw::GLint  compile_status = GL_FALSE;
		glw::GLuint shader		   = shaders[n_shader];

		if (shader != 0)
		{
			gl.compileShader(shader);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glCompileShader() call failed");

			gl.getShaderiv(shader, GL_COMPILE_STATUS, &compile_status);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glGetShaderiv() call failed");

			if (compile_status != GL_TRUE)
			{
				m_testCtx.getLog() << tcu::TestLog::Message << "Compilation of shader object at index " << n_shader
								   << " failed." << tcu::TestLog::EndMessage;

				TCU_FAIL("Shader compilation failed");
			}
		} /* if (shader != 0) */
	}	 /* for (all shaders) */

	/* Attach the shaders to the test program object, set up XFB and then link the program */
	glw::GLint		   link_status = GL_FALSE;
	const char*		   varyings[]  = { "result_tess_level_inner", "result_tess_level_outer" };
	const unsigned int n_varyings  = sizeof(varyings) / sizeof(varyings[0]);

	gl.transformFeedbackVaryings(out_test_ptr->po_id, n_varyings, varyings, GL_INTERLEAVED_ATTRIBS);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glTransformFeedbackVaryings() call failed");

	gl.attachShader(out_test_ptr->po_id, out_test_ptr->fs_id);
	gl.attachShader(out_test_ptr->po_id, out_test_ptr->vs_id);

	if (out_test_ptr->tcs_id != 0)
	{
		gl.attachShader(out_test_ptr->po_id, out_test_ptr->tcs_id);
	}

	if (out_test_ptr->tes_id != 0)
	{
		gl.attachShader(out_test_ptr->po_id, out_test_ptr->tes_id);
	}

	GLU_EXPECT_NO_ERROR(gl.getError(), "glAttachShader() call(s) failed.");

	gl.linkProgram(out_test_ptr->po_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glLinkProgram() call failed.");

	gl.getProgramiv(out_test_ptr->po_id, GL_LINK_STATUS, &link_status);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetProgramiv() call failed.");

	if (link_status != GL_TRUE)
	{
		TCU_FAIL("Program linking failed");
	}

	/* Retrieve uniform locations */
	out_test_ptr->inner_tess_levels_uniform_location = gl.getUniformLocation(out_test_ptr->po_id, "inner_tess_levels");
	out_test_ptr->outer_tess_levels_uniform_location = gl.getUniformLocation(out_test_ptr->po_id, "outer_tess_levels");

	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetUniformLocation() call(s) failed");

	if (test_type == TESSELLATION_TEST_TYPE_TCS_TES)
	{
		DE_ASSERT(out_test_ptr->inner_tess_levels_uniform_location != -1);
		DE_ASSERT(out_test_ptr->outer_tess_levels_uniform_location != -1);
	}
}